

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool bloaty::MmapInputFile::DoTryOpen
               (string_view filename,
               unique_ptr<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_> *file)

{
  InputFile *pIVar1;
  int iVar2;
  char *pcVar3;
  InputFile *pIVar4;
  int *piVar5;
  bool bVar6;
  char *pcVar7;
  size_t sVar8;
  size_t in_R9;
  size_t num_args;
  string_view format;
  string_view format_00;
  string_view format_01;
  FileDescriptor fd;
  string result;
  string str;
  stat buf;
  FileDescriptor local_12c;
  char *local_128;
  long local_120;
  char local_118;
  undefined7 uStack_117;
  long *local_108 [2];
  long local_f8 [2];
  size_t local_e8;
  char *local_e0;
  size_t local_d8;
  char *local_d0;
  stat local_c0;
  
  pcVar7 = filename._M_str;
  sVar8 = filename._M_len;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,pcVar7,pcVar7 + sVar8);
  local_12c.fd_ = open((char *)local_108[0],0);
  if (local_12c.fd_ < 0) {
    piVar5 = __errno_location();
    local_d0 = strerror(*piVar5);
    if (local_d0 == (char *)0x0) {
      local_d8 = 0;
    }
    else {
      local_d8 = strlen(local_d0);
    }
    local_128 = &local_118;
    local_120 = 0;
    local_118 = '\0';
    format._M_str = (char *)&local_e8;
    format._M_len = (size_t)"couldn\'t open file \'$0\': $1\n";
    local_e8 = sVar8;
    local_e0 = pcVar7;
    absl::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)&local_128,(Nonnull<std::string_*>)0x1c,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_128,local_120);
  }
  else {
    iVar2 = fstat(local_12c.fd_,&local_c0);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      local_d0 = strerror(*piVar5);
      if (local_d0 == (char *)0x0) {
        local_d8 = 0;
      }
      else {
        local_d8 = strlen(local_d0);
      }
      local_128 = &local_118;
      local_120 = 0;
      local_118 = '\0';
      format_00._M_str = (char *)&local_e8;
      format_00._M_len = (size_t)"couldn\'t stat file \'$0\': $1\n";
      local_e8 = sVar8;
      local_e0 = pcVar7;
      absl::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_128,(Nonnull<std::string_*>)0x1c,format_00,
                 (Nullable<const_absl::string_view_*>)0x2,in_R9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_128,local_120);
    }
    else {
      num_args = 0;
      pcVar3 = (char *)mmap((void *)0x0,local_c0.st_size,1,1,local_12c.fd_,0);
      if (pcVar3 != (char *)0xffffffffffffffff) {
        pIVar4 = (InputFile *)operator_new(0x38);
        pIVar4->_vptr_InputFile = (_func_int **)&PTR___cxa_pure_virtual_005ce000;
        (pIVar4->filename_)._M_dataplus._M_p = (pointer)&(pIVar4->filename_).field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&pIVar4->filename_,pcVar7,pcVar7 + sVar8);
        pIVar4->_vptr_InputFile = (_func_int **)&PTR_TryOpen_005ce120;
        (pIVar4->data_)._M_len = local_c0.st_size;
        (pIVar4->data_)._M_str = pcVar3;
        pIVar1 = (file->_M_t).
                 super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                 .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
        (file->_M_t).
        super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
        super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
        super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl = pIVar4;
        bVar6 = true;
        if (pIVar1 != (InputFile *)0x0) {
          (*pIVar1->_vptr_InputFile[2])();
        }
        goto LAB_0017588a;
      }
      piVar5 = __errno_location();
      local_d0 = strerror(*piVar5);
      if (local_d0 == (char *)0x0) {
        local_d8 = 0;
      }
      else {
        local_d8 = strlen(local_d0);
      }
      local_128 = &local_118;
      local_120 = 0;
      local_118 = '\0';
      format_01._M_str = (char *)&local_e8;
      format_01._M_len = (size_t)"couldn\'t mmap file \'$0\': $1";
      local_e8 = sVar8;
      local_e0 = pcVar7;
      absl::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)&local_128,(Nonnull<std::string_*>)0x1b,format_01,
                 (Nullable<const_absl::string_view_*>)0x2,num_args);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_128,local_120);
    }
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,CONCAT71(uStack_117,local_118) + 1);
  }
  bVar6 = false;
LAB_0017588a:
  FileDescriptor::~FileDescriptor(&local_12c);
  if (local_108[0] != local_f8) {
    operator_delete(local_108[0],local_f8[0] + 1);
  }
  return bVar6;
}

Assistant:

bool MmapInputFile::DoTryOpen(std::string_view filename,
                              std::unique_ptr<InputFile>& file) {
  std::string str(filename);
  FileDescriptor fd(open(str.c_str(), O_RDONLY));
  struct stat buf;
  const char* map;

  if (fd.fd() < 0) {
    std::cerr << absl::Substitute("couldn't open file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  if (fstat(fd.fd(), &buf) < 0) {
    std::cerr << absl::Substitute("couldn't stat file '$0': $1\n", filename,
                                  strerror(errno));
    return false;
  }

  map = static_cast<char*>(
      mmap(nullptr, buf.st_size, PROT_READ, MAP_SHARED, fd.fd(), 0));

  if (map == MAP_FAILED) {
    std::cerr << absl::Substitute("couldn't mmap file '$0': $1", filename,
                                  strerror(errno));
    return false;
  }

  file.reset(new MmapInputFile(filename, string_view(map, buf.st_size)));
  return true;
}